

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

protocol_descriptor * libtorrent::dht::node::map_protocol_to_descriptor(udp protocol)

{
  int iVar1;
  const_iterator pvVar2;
  const_iterator __last;
  protocol_descriptor *ppVar3;
  protocol_descriptor *iter;
  udp local_10;
  udp local_c;
  udp protocol_local;
  
  local_c = protocol.super_udp.family_;
  if (map_protocol_to_descriptor(libtorrent::udp)::descriptors == '\0') {
    iVar1 = __cxa_guard_acquire(&map_protocol_to_descriptor(libtorrent::udp)::descriptors);
    if (iVar1 != 0) {
      local_10 = boost::asio::ip::udp::v4();
      udp::udp((udp *)&map_protocol_to_descriptor::descriptors,&local_10);
      map_protocol_to_descriptor::descriptors._M_elems[0].family_name = "n4";
      map_protocol_to_descriptor::descriptors._M_elems[0].nodes_key = "nodes";
      iter._0_4_ = boost::asio::ip::udp::v6();
      udp::udp(&map_protocol_to_descriptor::descriptors._M_elems[1].protocol,(udp *)&iter);
      map_protocol_to_descriptor::descriptors._M_elems[1].family_name = "n6";
      map_protocol_to_descriptor::descriptors._M_elems[1].nodes_key = "nodes6";
      __cxa_guard_release(&map_protocol_to_descriptor(libtorrent::udp)::descriptors);
    }
  }
  pvVar2 = ::std::array<libtorrent::dht::node::protocol_descriptor,_2UL>::begin
                     (&map_protocol_to_descriptor::descriptors);
  __last = ::std::array<libtorrent::dht::node::protocol_descriptor,_2UL>::end
                     (&map_protocol_to_descriptor::descriptors);
  ppVar3 = ::std::
           find_if<libtorrent::dht::node::protocol_descriptor_const*,libtorrent::dht::node::map_protocol_to_descriptor(libtorrent::udp)::__0>
                     (pvVar2,__last,(udp *)&local_c);
  pvVar2 = ::std::array<libtorrent::dht::node::protocol_descriptor,_2UL>::end
                     (&map_protocol_to_descriptor::descriptors);
  if (ppVar3 == pvVar2) {
    libtorrent::aux::throw_ex<std::out_of_range,char_const(&)[17]>
              ((char (*) [17])"unknown protocol");
  }
  return ppVar3;
}

Assistant:

node::protocol_descriptor const& node::map_protocol_to_descriptor(udp const protocol)
{
	static std::array<protocol_descriptor, 2> const descriptors =
	{{
		{udp::v4(), "n4", "nodes"},
		{udp::v6(), "n6", "nodes6"}
	}};

	auto const iter = std::find_if(descriptors.begin(), descriptors.end()
		, [&protocol](protocol_descriptor const& d) { return d.protocol == protocol; });

	if (iter == descriptors.end())
	{
		TORRENT_ASSERT_FAIL();
		aux::throw_ex<std::out_of_range>("unknown protocol");
	}

	return *iter;
}